

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

void FACT_INTERNAL_UpdateCue(FACTCue *cue)

{
  uint8_t *puVar1;
  uint16_t nIndex;
  FACTAudioEngine *pEngine;
  FACTSoundInstance *pFVar2;
  FACTWave *pFVar3;
  undefined8 in_RAX;
  FACTTrackInstance *pFVar4;
  ulong uVar5;
  long lVar6;
  float next;
  float local_24;
  
  local_24 = (float)((ulong)in_RAX >> 0x20);
  if (((cue->data->flags & 4) == 0) && (((cue->field_7).sound)->flags == '\x03')) {
    pEngine = cue->parentBank->parentEngine;
    nIndex = ((cue->field_7).sound)->category;
    if ((pEngine->variables[(short)nIndex].accessibility & 4) == 0) {
      FACTAudioEngine_GetGlobalVariable(pEngine,nIndex,&local_24);
    }
    else {
      FACTCue_GetVariable(cue,nIndex,&local_24);
    }
    if ((local_24 != cue->interactive) || (NAN(local_24) || NAN(cue->interactive))) {
      cue->interactive = local_24;
      pFVar2 = cue->playingSound;
      if (pFVar2 != (FACTSoundInstance *)0x0) {
        pFVar2->parentCue->playingSound = (FACTSoundInstance *)0x0;
        lVar6 = 0;
        for (uVar5 = 0; uVar5 < pFVar2->sound->trackCount; uVar5 = uVar5 + 1) {
          pFVar4 = pFVar2->tracks;
          pFVar3 = *(FACTWave **)((long)&(pFVar4->activeWave).wave + lVar6);
          if (pFVar3 != (FACTWave *)0x0) {
            FACTWave_Destroy(pFVar3);
            pFVar4 = pFVar2->tracks;
          }
          pFVar3 = *(FACTWave **)((long)&(pFVar4->upcomingWave).wave + lVar6);
          if (pFVar3 != (FACTWave *)0x0) {
            FACTWave_Destroy(pFVar3);
            pFVar4 = pFVar2->tracks;
          }
          (*cue->parentBank->parentEngine->pFree)(*(void **)((long)&pFVar4->events + lVar6));
          lVar6 = lVar6 + 0x68;
        }
        (*cue->parentBank->parentEngine->pFree)(pFVar2->tracks);
        uVar5 = (ulong)pFVar2->sound->category;
        if (uVar5 != 0xffff) {
          puVar1 = &pFVar2->parentCue->parentBank->parentEngine->categories[uVar5].instanceCount;
          *puVar1 = *puVar1 + 0xff;
        }
      }
      FACT_INTERNAL_CreateSound(cue,0);
    }
  }
  return;
}

Assistant:

void FACT_INTERNAL_UpdateCue(FACTCue *cue)
{
	uint32_t i;
	float next;
	FACTSoundInstance *sound;

	/* Interactive sound selection */
	if (!(cue->data->flags & 0x04) && cue->variation->flags == 3)
	{
		/* Interactive */
		if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
		{
			FACTCue_GetVariable(
				cue,
				cue->variation->variable,
				&next
			);
		}
		else
		{
			FACTAudioEngine_GetGlobalVariable(
				cue->parentBank->parentEngine,
				cue->variation->variable,
				&next
			);
		}
		if (next != cue->interactive)
		{
			cue->interactive = next;

			/* New sound, time for death! */
			if (cue->playingSound != NULL)
			{
				/* Copy of DestroySound but does not set Cue to STOPPED */
				sound = cue->playingSound;
				sound->parentCue->playingSound = NULL;
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					if (sound->tracks[i].activeWave.wave != NULL)
					{
						FACTWave_Destroy(
							sound->tracks[i].activeWave.wave
						);
					}
					if (sound->tracks[i].upcomingWave.wave != NULL)
					{
						FACTWave_Destroy(
							sound->tracks[i].upcomingWave.wave
						);
					}
					cue->parentBank->parentEngine->pFree(
						sound->tracks[i].events
					);
				}
				cue->parentBank->parentEngine->pFree(sound->tracks);

				if (sound->sound->category != FACTCATEGORY_INVALID)
				{
					sound->parentCue->parentBank->parentEngine->categories[
						sound->sound->category
					].instanceCount -= 1;
				}
			}

			/* TODO: Reset cue times? Transition tables...?
			cue->start = elapsed;
			cue->elapsed = 0;
			 */

			FACT_INTERNAL_CreateSound(cue, 0 /* fadeIn */);
		}
	}
}